

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus
ZyanVectorInitEx(ZyanVector *vector,ZyanUSize element_size,ZyanUSize capacity,
                ZyanMemberProcedure destructor,ZyanAllocator *allocator,ZyanU8 growth_factor,
                ZyanU8 shrink_threshold)

{
  ZyanUSize local_48;
  ZyanU8 growth_factor_local;
  ZyanAllocator *allocator_local;
  ZyanMemberProcedure destructor_local;
  ZyanUSize capacity_local;
  ZyanUSize element_size_local;
  ZyanVector *vector_local;
  
  if ((((vector == (ZyanVector *)0x0) || (element_size == 0)) || (allocator == (ZyanAllocator *)0x0)
      ) || (growth_factor == '\0')) {
    vector_local._4_4_ = 0x80100004;
  }
  else {
    if (allocator->allocate == (ZyanAllocatorAllocate)0x0) {
      __assert_fail("allocator->allocate",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0xc9,
                    "ZyanStatus ZyanVectorInitEx(ZyanVector *, ZyanUSize, ZyanUSize, ZyanMemberProcedure, ZyanAllocator *, ZyanU8, ZyanU8)"
                   );
    }
    vector->allocator = allocator;
    vector->growth_factor = growth_factor;
    vector->shrink_threshold = shrink_threshold;
    vector->size = 0;
    local_48 = capacity;
    if (capacity == 0) {
      local_48 = 1;
    }
    vector->capacity = local_48;
    vector->element_size = element_size;
    vector->destructor = destructor;
    vector->data = (void *)0x0;
    vector_local._4_4_ =
         (*allocator->allocate)
                   (vector->allocator,&vector->data,vector->element_size,vector->capacity);
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorInitEx(ZyanVector* vector, ZyanUSize element_size, ZyanUSize capacity,
    ZyanMemberProcedure destructor, ZyanAllocator* allocator, ZyanU8 growth_factor,
    ZyanU8 shrink_threshold)
{
    if (!vector || !element_size || !allocator || (growth_factor < 1))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_ASSERT(allocator->allocate);

    vector->allocator        = allocator;
    vector->growth_factor    = growth_factor;
    vector->shrink_threshold = shrink_threshold;
    vector->size             = 0;
    vector->capacity         = ZYAN_MAX(ZYAN_VECTOR_MIN_CAPACITY, capacity);
    vector->element_size     = element_size;
    vector->destructor       = destructor;
    vector->data             = ZYAN_NULL;

    return allocator->allocate(vector->allocator, &vector->data, vector->element_size,
        vector->capacity);
}